

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# b3D_integrator.cpp
# Opt level: O2

void __thiscall NetworkNS::cb3D_integrator::cell_density_nodal_points(cb3D_integrator *this)

{
  int *piVar1;
  double *pdVar2;
  Domain *pDVar3;
  void *pvVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  int i;
  uint inode;
  double znew;
  double ynew;
  double xnew;
  void *local_38;
  
  uVar8 = this->cur_bd_net->grid->ncells;
  local_38 = malloc((long)(int)uVar8 << 2);
  uVar7 = 0;
  uVar6 = 0;
  if (0 < (int)uVar8) {
    uVar6 = (ulong)uVar8;
  }
  for (; uVar6 != uVar7; uVar7 = uVar7 + 1) {
    *(undefined4 *)((long)local_38 + uVar7 * 4) = 0;
  }
  uVar8 = 2;
  for (uVar6 = 0; pvVar4 = local_38, uVar6 < this->dofs; uVar6 = uVar6 + 1) {
    pdVar2 = this->bd_x;
    xnew = pdVar2[uVar8 - 2];
    ynew = pdVar2[uVar8 - 1];
    znew = pdVar2[uVar8];
    Domain::minimum_image(this->cur_bd_net->domain,&xnew,&ynew,&znew);
    pDVar3 = this->cur_bd_net->domain;
    xnew = pDVar3->XBoxLen * 0.5 + xnew;
    ynew = pDVar3->YBoxLen * 0.5 + ynew;
    znew = pDVar3->ZBoxLen * 0.5 + znew;
    iVar5 = Grid::find_grid_cell(this->cur_bd_net->grid,&xnew,&ynew,&znew);
    piVar1 = (int *)((long)local_38 + (long)iVar5 * 4);
    *piVar1 = *piVar1 + 1;
    uVar8 = uVar8 + 3;
  }
  for (uVar6 = 0; (long)uVar6 < (long)this->cur_bd_net->grid->ncells; uVar6 = uVar6 + 1) {
    fprintf((FILE *)this->p_cell_density,"%d  %d\n",uVar6 & 0xffffffff,
            (ulong)*(uint *)((long)pvVar4 + uVar6 * 4));
  }
  return;
}

Assistant:

void cb3D_integrator::cell_density_nodal_points() {

      double xnew, ynew, znew;
      int Id;
      int *hist_grid = (int*) malloc(cur_bd_net->grid->ncells * sizeof (int));

      for (int i = 0; i < cur_bd_net->grid->ncells; i++)
         hist_grid[i] = 0;

      for (unsigned int inode = 0; inode < dofs; inode++) {

         xnew = bd_x[3 * inode + 0];
         ynew = bd_x[3 * inode + 1];
         znew = bd_x[3 * inode + 2];
         cur_bd_net->domain->minimum_image(xnew, ynew, znew);
         xnew = xnew + cur_bd_net->domain->XBoxLen / 2.0;
         ynew = ynew + cur_bd_net->domain->YBoxLen / 2.0;
         znew = znew + cur_bd_net->domain->ZBoxLen / 2.0;
         Id = cur_bd_net->grid->find_grid_cell(xnew, ynew, znew);
         hist_grid[Id] = hist_grid[Id] + 1;

      }

      for (int i = 0; i < cur_bd_net->grid->ncells; i++)
         fprintf(p_cell_density, "%d " " %d\n", i, hist_grid[i]);

      return;
   }